

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O3

void google::protobuf::CleanStringLineEndings(string *str,bool auto_end_last_line)

{
  size_type sVar1;
  pointer pcVar2;
  ulong uVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  sVar1 = str->_M_string_length;
  if ((long)sVar1 < 1) {
    lVar9 = 0;
  }
  else {
    pcVar2 = (str->_M_dataplus)._M_p;
    lVar9 = 0;
    bVar4 = false;
    lVar8 = 0;
    lVar10 = lVar9;
    lVar6 = lVar8;
    do {
      while (((lVar7 = lVar6, lVar5 = lVar10, !bVar4 &&
              (lVar7 = lVar8, lVar5 = lVar9, lVar8 + 8 < (long)sVar1)) &&
             (uVar3 = *(ulong *)(pcVar2 + lVar8),
             (~(0xe0e0e0e0e0e0e0d - uVar3 | uVar3) & 0x8080808080808080) == 0))) {
        if (lVar9 != lVar8) {
          *(ulong *)(pcVar2 + lVar9) = uVar3;
        }
        lVar9 = lVar9 + 8;
        lVar8 = lVar8 + 8;
      }
      lVar9 = lVar5;
      if (pcVar2[lVar7] == '\n') {
        lVar8 = lVar9;
        if (lVar7 != lVar9) {
          pcVar2[lVar9] = '\n';
        }
LAB_001dcd01:
        lVar9 = lVar8 + 1;
        bVar4 = false;
      }
      else {
        if (pcVar2[lVar7] != '\r') {
          if (bVar4) {
            pcVar2[lVar9] = '\n';
            lVar9 = lVar9 + 1;
          }
          lVar8 = lVar7;
          if (lVar7 != lVar9) {
            pcVar2[lVar9] = pcVar2[lVar7];
            lVar8 = lVar9;
          }
          goto LAB_001dcd01;
        }
        if (bVar4) {
          pcVar2[lVar9] = '\n';
          lVar9 = lVar9 + 1;
        }
        bVar4 = true;
      }
      lVar8 = lVar7 + 1;
      lVar10 = lVar9;
      lVar6 = lVar8;
    } while (lVar8 < (long)sVar1);
    if ((bVar4) || (((auto_end_last_line && (0 < lVar9)) && (pcVar2[lVar9 + -1] != '\n')))) {
      std::__cxx11::string::resize((ulong)str,(char)lVar9 + '\x01');
      (str->_M_dataplus)._M_p[lVar9] = '\n';
      return;
    }
  }
  if ((long)sVar1 <= lVar9) {
    return;
  }
  std::__cxx11::string::resize((ulong)str,(char)lVar9);
  return;
}

Assistant:

void CleanStringLineEndings(std::string *str, bool auto_end_last_line) {
  ptrdiff_t output_pos = 0;
  bool r_seen = false;
  ptrdiff_t len = str->size();

  char *p = &(*str)[0];

  for (ptrdiff_t input_pos = 0; input_pos < len;) {
    if (!r_seen && input_pos + 8 < len) {
      uint64_t v = GOOGLE_UNALIGNED_LOAD64(p + input_pos);
      // Loop over groups of 8 bytes at a time until we come across
      // a word that has a byte whose value is less than or equal to
      // '\r' (i.e. could contain a \n (0x0a) or a \r (0x0d) ).
      //
      // We use a has_less macro that quickly tests a whole 64-bit
      // word to see if any of the bytes has a value < N.
      //
      // For more details, see:
      //   http://graphics.stanford.edu/~seander/bithacks.html#HasLessInWord
#define has_less(x, n) (((x) - ~0ULL / 255 * (n)) & ~(x) & ~0ULL / 255 * 128)
      if (!has_less(v, '\r' + 1)) {
#undef has_less
        // No byte in this word has a value that could be a \r or a \n
        if (output_pos != input_pos) {
          GOOGLE_UNALIGNED_STORE64(p + output_pos, v);
        }
        input_pos += 8;
        output_pos += 8;
        continue;
      }
    }
    std::string::const_reference in = p[input_pos];
    if (in == '\r') {
      if (r_seen) p[output_pos++] = '\n';
      r_seen = true;
    } else if (in == '\n') {
      if (input_pos != output_pos)
        p[output_pos++] = '\n';
      else
        output_pos++;
      r_seen = false;
    } else {
      if (r_seen) p[output_pos++] = '\n';
      r_seen = false;
      if (input_pos != output_pos)
        p[output_pos++] = in;
      else
        output_pos++;
    }
    input_pos++;
  }
  if (r_seen ||
      (auto_end_last_line && output_pos > 0 && p[output_pos - 1] != '\n')) {
    str->resize(output_pos + 1);
    str->operator[](output_pos) = '\n';
  } else if (output_pos < len) {
    str->resize(output_pos);
  }
}